

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blobs.cpp
# Opt level: O3

void local_sum(Block *b,ProxyWithLink *cp)

{
  result_type_conflict *prVar1;
  Link *pLVar2;
  pointer plVar3;
  pointer plVar4;
  result_type_conflict rVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  long *v;
  result_type_conflict *prVar8;
  long lVar9;
  pointer pBVar10;
  OutgoingQueues *this;
  long lVar11;
  int64_t sum;
  default_random_engine generator;
  uniform_int_distribution<long> distribution;
  long local_50;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  uVar7 = (ulong)(cp->super_Proxy).gid_;
  local_48._M_x = uVar7 % 0x7fffffff + (ulong)(uVar7 % 0x7fffffff == 0);
  local_40 = 0xfffffffffffffff7;
  local_38 = 9;
  local_50 = 0;
  prVar8 = (b->buffer).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  prVar1 = (b->buffer).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (prVar8 != prVar1) {
    do {
      lVar9 = local_50;
      rVar5 = std::uniform_int_distribution<long>::operator()
                        (&local_40,&local_48,(param_type *)&local_40);
      *prVar8 = rVar5;
      local_50 = lVar9 + rVar5;
      prVar8 = prVar8 + 1;
    } while (prVar8 != prVar1);
  }
  pLVar2 = cp->link_;
  pBVar10 = (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pLVar2->neighbors_).
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar10) >> 3)) {
    this = &(cp->super_Proxy).outgoing_;
    lVar11 = 0;
    lVar9 = 0;
    do {
      plVar3 = (b->buffer).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar4 = (b->buffer).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pmVar6 = Catch::clara::std::
               map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
               ::operator[](this,(key_type *)((long)&pBVar10->gid + lVar11));
      (*(pmVar6->super_BinaryBuffer)._vptr_BinaryBuffer[8])
                (pmVar6,plVar3,(long)plVar4 - (long)plVar3);
      pmVar6 = Catch::clara::std::
               map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
               ::operator[](this,(key_type *)
                                 ((long)&((pLVar2->neighbors_).
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->gid + lVar11))
      ;
      (*(pmVar6->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar6,&local_50,8);
      lVar9 = lVar9 + 1;
      pBVar10 = (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 8;
    } while (lVar9 < (int)((ulong)((long)(pLVar2->neighbors_).
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar10)
                          >> 3));
  }
  return;
}

Assistant:

void local_sum(Block* b, const diy::Master::ProxyWithLink& cp)
{
    std::default_random_engine generator(cp.gid());
    std::uniform_int_distribution<std::int64_t> distribution(-9, 9);

    std::int64_t sum = 0;
    for (auto &v : b->buffer)
    {
      v = distribution(generator);
      sum += v;
    }

    diy::Link* l = cp.link();
    for (int i = 0; i < l->size(); ++i)
    {
      cp.enqueue_blob(l->target(i), (const char*) b->buffer.data(), b->buffer.size() * sizeof(std::int64_t));
      cp.enqueue(l->target(i), sum);
    }
}